

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O3

void curve_getrect(t_gobj *z,_glist *glist,t_word *data,t_template *template,t_float basex,
                  t_float basey,int *xp1,int *yp1,int *xp2,int *yp2)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  t_pd f;
  int iVar6;
  int iVar7;
  int iVar8;
  float fVar9;
  t_float tVar10;
  
  if (*(char *)&z[0xb].g_pd == '\x01') {
    iVar3 = *(int *)&z[0xd].g_next;
    if (*(char *)((long)&z[0xb].g_pd + 1) == '\0') {
      fVar9 = *(float *)&z[0xb].g_next;
    }
    else {
      fVar9 = template_getfloat(template,(t_symbol *)z[0xb].g_next,data,0);
    }
    if ((fVar9 != 0.0) || (NAN(fVar9))) {
      if ((glist->field_0xe8 & 0x20) == 0) {
        uVar1 = *(uint *)&z[3].g_pd & 4;
      }
      else {
        uVar1 = *(uint *)&z[3].g_pd & 8;
      }
      if (uVar1 == 0) {
        if (iVar3 < 1) {
          iVar7 = -0x7fffffff;
          iVar8 = 0x7fffffff;
          iVar4 = 0x7fffffff;
          iVar6 = -0x7fffffff;
        }
        else {
          f = z[0xe].g_pd;
          iVar4 = 0x7fffffff;
          iVar6 = -0x7fffffff;
          iVar7 = -0x7fffffff;
          iVar8 = 0x7fffffff;
          do {
            tVar10 = fielddesc_getcoord((_fielddesc *)f,template,data,0);
            tVar10 = glist_xtopixels(glist,tVar10 + basex);
            iVar5 = (int)tVar10;
            tVar10 = fielddesc_getcoord((_fielddesc *)&f->c_nmethod,template,data,0);
            tVar10 = glist_ytopixels(glist,tVar10 + basey);
            iVar2 = (int)tVar10;
            if (iVar5 <= iVar8) {
              iVar8 = iVar5;
            }
            if (iVar7 <= iVar5) {
              iVar7 = iVar5;
            }
            if (iVar2 <= iVar4) {
              iVar4 = iVar2;
            }
            if (iVar6 <= iVar2) {
              iVar6 = iVar2;
            }
            f = (t_pd)&f->c_symbolmethod;
            iVar3 = iVar3 + -1;
          } while (iVar3 != 0);
        }
        *xp1 = iVar8;
        *yp1 = iVar4;
        *xp2 = iVar7;
        *yp2 = iVar6;
        return;
      }
    }
  }
  *yp1 = 0x7fffffff;
  *xp1 = 0x7fffffff;
  *yp2 = -0x7fffffff;
  *xp2 = -0x7fffffff;
  return;
}

Assistant:

static void curve_getrect(t_gobj *z, t_glist *glist,
    t_word *data, t_template *template, t_float basex, t_float basey,
    int *xp1, int *yp1, int *xp2, int *yp2)
{
    t_curve *x = (t_curve *)z;
    int i, n = x->x_npoints;
    t_fielddesc *f = x->x_vec;
    int x1 = 0x7fffffff, x2 = -0x7fffffff, y1 = 0x7fffffff, y2 = -0x7fffffff;
    if (!fielddesc_getfloat(&x->x_vis, template, data, 0) ||
        (glist->gl_edit && x->x_flags & NOMOUSEEDIT) ||
        (!glist->gl_edit && x->x_flags & NOMOUSERUN))
    {
        *xp1 = *yp1 = 0x7fffffff;
        *xp2 = *yp2 = -0x7fffffff;
        return;
    }
    for (i = 0, f = x->x_vec; i < n; i++, f += 2)
    {
        int xloc = glist_xtopixels(glist,
            basex + fielddesc_getcoord(f, template, data, 0));
        int yloc = glist_ytopixels(glist,
            basey + fielddesc_getcoord(f+1, template, data, 0));
        if (xloc < x1) x1 = xloc;
        if (xloc > x2) x2 = xloc;
        if (yloc < y1) y1 = yloc;
        if (yloc > y2) y2 = yloc;
    }
    *xp1 = x1;
    *yp1 = y1;
    *xp2 = x2;
    *yp2 = y2;
}